

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledInputFile::Data::Data(Data *this,int numThreads)

{
  Compression compression;
  float in_ESI;
  V2f *in_RDI;
  V2f *__new_size;
  DeepFrameBuffer *in_stack_ffffffffffffffa0;
  Array<char> *this_00;
  Vec2<float> *this_01;
  LevelMode r;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  
  std::mutex::mutex((mutex *)0x2e7a95);
  compression = (Compression)((ulong)(in_RDI + 5) >> 0x20);
  this_01 = (Vec2<float> *)&stack0xffffffffffffffec;
  Imath_2_5::Vec2<float>::Vec2(this_01,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                 in_RDI,(float)((ulong)this_01 >> 0x20),(LineOrder)this_01,compression);
  TileDescription::TileDescription((TileDescription *)(in_RDI + 0xc),0x20,0x20,r,r);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_ffffffffffffffa0);
  in_RDI[0x20].x = 0.0;
  in_RDI[0x20].y = 0.0;
  in_RDI[0x21].x = 0.0;
  in_RDI[0x21].y = 0.0;
  TileOffsets::TileOffsets
            ((TileOffsets *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (LevelMode)in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4,
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int *)CONCAT44(in_stack_ffffffffffffffd4,r));
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
            *)0x2e7b6b);
  in_RDI[0x2b].x = -NAN;
  *(undefined1 *)&in_RDI[0x2b].y = 0;
  in_RDI[0x2c].x = in_ESI;
  __new_size = in_RDI + 0x2e;
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)0x2e7b9c);
  *(undefined1 *)&in_RDI[0x31].x = 0;
  this_00 = (Array<char> *)(in_RDI + 0x36);
  Array<char>::Array(this_00);
  in_RDI[0x38].x = 0.0;
  in_RDI[0x38].y = 0.0;
  in_RDI[0x3b].x = 0.0;
  in_RDI[0x3b].y = 0.0;
  *(undefined1 *)&in_RDI[0x3c].x = 0;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::resize((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)this_00,(size_type)__new_size);
  return;
}

Assistant:

DeepTiledInputFile::Data::Data (int numThreads):
    numXTiles (0),
    numYTiles (0),
    partNumber (-1),
    multiPartBackwardSupport(false),
    numThreads(numThreads),
    memoryMapped(false),
    sampleCountTableComp(nullptr),
    _streamData(nullptr),
    _deleteStream(false)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}